

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O3

void bench_get_msurf_descriptor
               (vector<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
                *functions,integral_image *iimage,
               vector<interest_point,_std::allocator<interest_point>_> *interest_points,
               vector<benchmark_data,_std::allocator<benchmark_data>_> *data)

{
  pointer piVar1;
  undefined1 auVar2 [16];
  double *pdVar3;
  double *pdVar4;
  benchmark_data *pbVar5;
  ulong uVar6;
  undefined8 extraout_RDX;
  long lVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  interest_point *unaff_R12;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar18 [16];
  interest_point ipoint;
  long lStack_1f8;
  double dStack_1e8;
  double *pdStack_1e0;
  double *pdStack_1d8;
  double *pdStack_1d0;
  double dStack_1c0;
  benchmark_data *pbStack_1b8;
  double dStack_1b0;
  long lStack_1a8;
  interest_point *piStack_1a0;
  ulong uStack_198;
  vector<interest_point,_std::allocator<interest_point>_> *pvStack_190;
  ulong uStack_188;
  code *pcStack_180;
  uint local_16c;
  vector<benchmark_data,_std::allocator<benchmark_data>_> *local_168;
  uint local_15c;
  vector<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
  *local_158;
  integral_image *local_150;
  interest_point local_144;
  
  if ((functions->
      super__Vector_base<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (functions->
      super__Vector_base<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar12 = 0;
    local_168 = data;
    local_158 = functions;
    local_150 = iimage;
    do {
      lVar7 = uVar12 * 0x238;
      local_15c = *(uint *)(*(long *)local_168 + 0x208 + lVar7);
      pbVar5 = (benchmark_data *)(ulong)local_15c;
      local_16c = 5;
      if ((int)local_15c < 5) {
        local_16c = local_15c;
      }
      if (0 < (int)local_15c) {
        uVar11 = (ulong)local_16c;
        uVar9 = 0;
        do {
          piVar1 = (interest_points->
                   super__Vector_base<interest_point,_std::allocator<interest_point>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar6 = ((long)(interest_points->
                         super__Vector_base<interest_point,_std::allocator<interest_point>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar1 >> 2) *
                  -0xed7303b5cc0ed73;
          if (uVar6 < uVar9 || uVar6 - uVar9 == 0) {
            pcVar10 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
            pcStack_180 = perf_get_msurf_descriptor;
            uVar6 = uVar9;
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar9);
            dVar14 = 1.0;
            lStack_1f8 = 100;
            pbStack_1b8 = pbVar5;
            lStack_1a8 = lVar7;
            piStack_1a0 = unaff_R12;
            uStack_198 = uVar11;
            pvStack_190 = interest_points;
            uStack_188 = uVar12;
            pcStack_180 = (code *)uVar9;
            do {
              cpuid_basic_info(0);
              uVar12 = rdtsc();
              lStack_1f8 = (long)(dVar14 * (double)lStack_1f8);
              for (lVar7 = lStack_1f8; lVar7 != 0; lVar7 = lVar7 + -1) {
                (*(code *)pcVar10)(uVar6,extraout_RDX);
              }
              uVar9 = rdtsc();
              cpuid_basic_info(0);
              auVar13 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                           (((ulong)(uint)-(int)(uVar12 >> 0x20) << 0x20) -
                                           (uVar12 & 0xffffffff)) +
                                           (uVar9 & 0xffffffff) + (uVar9 & 0xffffffff00000000));
              dStack_1e8 = auVar13._0_8_;
              dVar14 = 100000000.0 / dStack_1e8;
            } while (2.0 < dVar14);
            lVar7 = 0;
            pdStack_1e0 = (double *)0x0;
            pdStack_1d8 = (double *)0x0;
            dStack_1b0 = (double)lStack_1f8;
            pdStack_1d0 = (double *)0x0;
            dStack_1c0 = 0.0;
            do {
              cpuid_basic_info(0);
              uVar12 = rdtsc();
              for (lVar8 = lStack_1f8; lVar8 != 0; lVar8 = lVar8 + -1) {
                (*(code *)pcVar10)(uVar6,extraout_RDX);
              }
              uVar9 = rdtsc();
              cpuid_basic_info(0);
              auVar13 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                           (((ulong)(uint)-(int)(uVar12 >> 0x20) << 0x20) -
                                           (uVar12 & 0xffffffff)) +
                                           (uVar9 & 0xffffffff) + (uVar9 & 0xffffffff00000000));
              dVar14 = auVar13._0_8_ / dStack_1b0;
              dStack_1e8 = dVar14;
              if (pdStack_1d8 == pdStack_1d0) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          ((vector<double,std::allocator<double>> *)&pdStack_1e0,
                           (iterator)pdStack_1d8,&dStack_1e8);
              }
              else {
                *pdStack_1d8 = dVar14;
                pdStack_1d8 = pdStack_1d8 + 1;
              }
              pbVar5 = pbStack_1b8;
              pdVar4 = pdStack_1d8;
              pdVar3 = pdStack_1e0;
              lVar7 = lVar7 + 1;
              dStack_1c0 = dStack_1c0 + dVar14;
            } while (lVar7 != 10);
            dVar14 = dStack_1c0 / 10.0;
            lVar7 = *(long *)(pbStack_1b8 + 0x210);
            dStack_1e8 = dVar14;
            if (pdStack_1e0 != pdStack_1d8) {
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (pdStack_1e0,pdStack_1d8,
                         (int)LZCOUNT((long)pdStack_1d8 - (long)pdStack_1e0 >> 3) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (pdVar3,pdVar4);
            }
            auVar15._8_8_ = 0;
            auVar15._0_8_ = dStack_1e8;
            auVar16._0_8_ = ((double)lVar7 * 100.0) / dVar14;
            auVar16._8_8_ = 0;
            auVar18._8_8_ = 0x3fdfffffffffffff;
            auVar18._0_8_ = 0x3fdfffffffffffff;
            auVar2._8_8_ = 0x8000000000000000;
            auVar2._0_8_ = 0x8000000000000000;
            auVar13 = vpternlogq_avx512vl(auVar18,auVar16,auVar2,0xf8);
            auVar17._8_8_ = 0;
            auVar17._0_8_ = auVar16._0_8_ + auVar13._0_8_;
            auVar2 = vroundsd_avx(auVar17,auVar17,0xb);
            auVar13 = vmovhpd_avx(auVar15,*pdStack_1e0);
            auVar13 = vcvttpd2uqq_avx512vl(auVar13);
            auVar13 = vpaddq_avx(auVar13,*(undefined1 (*) [16])(pbVar5 + 0x218));
            *(undefined1 (*) [16])(pbVar5 + 0x218) = auVar13;
            auVar13._8_8_ = 0;
            auVar13._0_8_ = pdStack_1d8[-1];
            lVar7 = vcvttsd2usi_avx512f(auVar13);
            *(long *)(pbVar5 + 0x228) = *(long *)(pbVar5 + 0x228) + lVar7;
            *(double *)(pbVar5 + 0x230) = auVar2._0_8_ / 100.0 + *(double *)(pbVar5 + 0x230);
            operator_delete(pdStack_1e0,(long)pdStack_1d0 - (long)pdStack_1e0);
            return;
          }
          unaff_R12 = &local_144;
          pcStack_180 = (code *)0x10bcc0;
          memcpy(unaff_R12,piVar1 + uVar9,0x114);
          pbVar5 = (benchmark_data *)(*(long *)local_168 + lVar7);
          pcStack_180 = (code *)0x10bce4;
          perf_get_msurf_descriptor
                    ((local_158->
                     super__Vector_base<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar12],local_150,unaff_R12,pbVar5);
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar11);
      }
      if (local_15c != 0) {
        lVar8 = *(long *)local_168;
        uVar9 = (ulong)(int)local_16c;
        *(ulong *)(lVar8 + 0x218 + lVar7) = *(ulong *)(lVar8 + 0x218 + lVar7) / uVar9;
        *(ulong *)(lVar8 + 0x228 + lVar7) = *(ulong *)(lVar8 + 0x228 + lVar7) / uVar9;
        *(ulong *)(lVar8 + 0x220 + lVar7) = *(ulong *)(lVar8 + 0x220 + lVar7) / uVar9;
        *(double *)(lVar8 + 0x230 + lVar7) =
             *(double *)(lVar8 + 0x230 + lVar7) / (double)(int)local_16c;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)(local_158->
                                    super__Vector_base<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_158->
                                    super__Vector_base<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void bench_get_msurf_descriptor(
    const std::vector<void (*)(struct integral_image *, struct interest_point *)> &functions,
    struct integral_image *iimage, std::vector<struct interest_point> *interest_points,
    std::vector<struct benchmark_data> &data) {
    assert(functions.size() == data.size());

    // Iterating through all functions that should be benchmarked
    for (int j = 0; j < functions.size(); ++j) {
        // Specifies how many times the timing for get_msurf_descriptor will be called. The average will be taken.
        int counter = MIN(5, data[j].num_interest_points);
        for (int i = 0; i < counter; ++i) {
            struct interest_point ipoint = interest_points->at(i);
            perf_get_msurf_descriptor(functions[j], iimage, &ipoint, data[j]);
        }

        // Take the average of the runs.
        if (counter != 0) {
            data[j].avg_cycles /= counter;
            data[j].max_cycles /= counter;
            data[j].min_cycles /= counter;
            data[j].flops_per_cycle /= counter;
        }
    }
}